

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt * __thiscall slang::SVInt::operator--(SVInt *this)

{
  ulong *puVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  uint32_t i;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar3 = (this->super_SVIntStorage).bitWidth;
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  if (uVar3 < 0x41 && (bVar2 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.pVal =
         (uint64_t *)((this->super_SVIntStorage).field_0.val - 1);
  }
  else if ((bVar2 & 1U) == 0) {
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    uVar7 = 1;
    uVar6 = 0;
    bVar8 = false;
    do {
      if ((uVar3 + 0x3f >> 6) << (bVar2 & 0x1fU) == uVar6) break;
      puVar1 = puVar4 + uVar6;
      uVar5 = (ulong)bVar8;
      bVar8 = *puVar1 < uVar7 || *puVar1 - uVar7 < uVar5;
      *puVar1 = (*puVar1 - uVar7) - uVar5;
      uVar6 = uVar6 + 1;
      uVar7 = 0;
    } while (bVar8);
  }
  else {
    setAllX(this);
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator--() {
    if (isSingleWord())
        --val;
    else if (unknownFlag)
        setAllX();
    else
        subOne(pVal, pVal, getNumWords(), 1);
    clearUnusedBits();
    return *this;
}